

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O2

Matrix<float,_2,_1> __thiscall tcu::operator*(tcu *this,Matrix<float,_2,_1> *mtx,float scalar)

{
  Matrix<float,_2,_1> MVar1;
  int row;
  long lVar2;
  float extraout_XMM0_Da;
  float fVar3;
  float extraout_XMM0_Db;
  float fVar4;
  
  Matrix<float,_2,_1>::Matrix((Matrix<float,_2,_1> *)this);
  fVar3 = extraout_XMM0_Da;
  fVar4 = extraout_XMM0_Db;
  for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
    fVar4 = 0.0;
    fVar3 = (mtx->m_data).m_data[0].m_data[lVar2] * scalar;
    *(float *)(this + lVar2 * 4) = fVar3;
  }
  MVar1.m_data.m_data[0].m_data[1] = fVar4;
  MVar1.m_data.m_data[0].m_data[0] = fVar3;
  return (Matrix<float,_2,_1>)MVar1.m_data.m_data[0].m_data;
}

Assistant:

Matrix<T, Rows, Cols> operator* (const Matrix<T, Rows, Cols>& mtx, T scalar)
{
	Matrix<T, Rows, Cols> res;
	for (int col = 0; col < Cols; col++)
		for (int row = 0; row < Rows; row++)
			res(row, col) = mtx(row, col) * scalar;
	return res;
}